

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

bool Js::JavascriptOperators::IsConstructor(JavascriptProxy *instance)

{
  bool bVar1;
  int iVar2;
  RecyclableObject *obj;
  JavascriptFunction *pJVar3;
  byte unaff_R14B;
  
  do {
    obj = JavascriptProxy::GetTarget(instance);
    bVar1 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(obj);
    if (bVar1) {
      instance = UnsafeVarTo<Js::JavascriptProxy,Js::RecyclableObject>(obj);
    }
    else {
      instance = (JavascriptProxy *)0x0;
    }
    if (instance == (JavascriptProxy *)0x0) {
      bVar1 = VarIsImpl<Js::JavascriptFunction>(obj);
      if (bVar1) {
        pJVar3 = UnsafeVarTo<Js::JavascriptFunction,Js::RecyclableObject>(obj);
      }
      else {
        pJVar3 = (JavascriptFunction *)0x0;
      }
      if (pJVar3 == (JavascriptFunction *)0x0) {
        unaff_R14B = 0;
      }
      else {
        iVar2 = (*(pJVar3->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x70])();
        unaff_R14B = iVar2 != 0;
      }
    }
  } while (instance != (JavascriptProxy *)0x0);
  return (bool)(unaff_R14B & 1);
}

Assistant:

bool JavascriptOperators::IsConstructor(_In_ JavascriptProxy * instance)
    {
        // If it is a proxy, follow to the end of the proxy chain before checking if it is a constructor again.
        JavascriptProxy * proxy = instance;
        while (true)
        {
            RecyclableObject* targetInstance = proxy->GetTarget();
            proxy = JavascriptOperators::TryFromVar<JavascriptProxy>(targetInstance);
            if (proxy == nullptr)
            {
                JavascriptFunction* function = JavascriptOperators::TryFromVar<JavascriptFunction>(targetInstance);
                return function && function->IsConstructor();
            }
        }
    }